

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O2

void __thiscall
Fl_Graphics_Driver::loop
          (Fl_Graphics_Driver *this,int x,int y,int x1,int y1,int x2,int y2,int x3,int y3)

{
  XPoint p [5];
  
  p[0].x = (short)x;
  p[0].y = (short)y;
  p[1].x = (short)x1;
  p[1].y = (short)y1;
  p[2].x = (short)x2;
  p[2].y = (short)y2;
  p[3].x = (short)x3;
  p[3].y = (short)y3;
  p[4].x = p[0].x;
  p[4].y = p[0].y;
  XDrawLines(fl_display,fl_window,fl_gc,p,5,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::loop(int x, int y, int x1, int y1, int x2, int y2, int x3, int y3) {
#if defined(USE_X11)
  XPoint p[5];
  p[0].x = x;  p[0].y = y;
  p[1].x = x1; p[1].y = y1;
  p[2].x = x2; p[2].y = y2;
  p[3].x = x3; p[3].y = y3;
  p[4].x = x;  p[4].y = y;
  XDrawLines(fl_display, fl_window, fl_gc, p, 5, 0);
#elif defined(WIN32)
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x1, y1);
  LineTo(fl_gc, x2, y2);
  LineTo(fl_gc, x3, y3);
  LineTo(fl_gc, x, y);
#elif defined(__APPLE_QUARTZ__)
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x1, y1);
  CGContextAddLineToPoint(fl_gc, x2, y2);
  CGContextAddLineToPoint(fl_gc, x3, y3);
  CGContextClosePath(fl_gc);
  CGContextStrokePath(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}